

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O3

void helper_sic(CPUS390XState_conflict *env,uint64_t r1,uint64_t r3)

{
  return;
}

Assistant:

void HELPER(sic)(CPUS390XState *env, uint64_t r1, uint64_t r3)
{
#if 0
    int r;

    qemu_mutex_lock_iothread();
    r = css_do_sic(env, (r3 >> 27) & 0x7, r1 & 0xffff);
    qemu_mutex_unlock_iothread();
    /* css_do_sic() may actually return a PGM_xxx value to inject */
    if (r) {
        tcg_s390_program_interrupt(env, -r, GETPC());
    }
#endif
}